

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateVertex
          (ON_SubD_FixedSizeHeap *this,double *vertexP,uint edge_capacity)

{
  ON_SubDVertex *pOVar1;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDVertex *pOVar3;
  uint uVar4;
  
  pOVar3 = this->m_v;
  if (((pOVar3 != (ON_SubDVertex *)0x0) && (uVar4 = this->m_v_index, uVar4 < this->m_v_capacity)) &&
     (this->m_p_index + edge_capacity * 2 <= this->m_p_capacity)) {
    if (edge_capacity == 0) {
      pOVar2 = (ON_SubDEdgePtr *)0x0;
    }
    else {
      if ((0xffff < edge_capacity) ||
         (pOVar2 = (ON_SubDEdgePtr *)AllocatePtrArray(this,edge_capacity * 2,true),
         pOVar2 == (ON_SubDEdgePtr *)0x0)) goto LAB_00611c0e;
      pOVar3 = this->m_v;
      uVar4 = this->m_v_index;
    }
    pOVar3 = pOVar3 + uVar4;
    memset(pOVar3,0,0x108);
    uVar4 = this->m_v_index;
    if (uVar4 != 0) {
      pOVar1 = this->m_v;
      pOVar1[uVar4 - 1].m_next_vertex = pOVar3;
      pOVar3->m_prev_vertex = pOVar1 + (uVar4 - 1);
    }
    this->m_v_index = uVar4 + 1;
    (pOVar3->super_ON_SubDComponentBase).m_id = uVar4 + 1;
    if (vertexP != (double *)0x0) {
      pOVar3->m_P[0] = *vertexP;
      pOVar3->m_P[1] = vertexP[1];
      pOVar3->m_P[2] = vertexP[2];
    }
    if (edge_capacity == 0) {
      return pOVar3;
    }
    pOVar3->m_edge_capacity = (unsigned_short)edge_capacity;
    pOVar3->m_edges = pOVar2;
    pOVar3->m_face_capacity = (unsigned_short)edge_capacity;
    pOVar3->m_faces = (ON_SubDFace **)(pOVar2 + edge_capacity);
    return pOVar3;
  }
LAB_00611c0e:
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

ON_SubDVertex* ON_SubD_FixedSizeHeap::AllocateVertex(
  const double vertexP[3],
  unsigned int edge_capacity
  )
{
  if (nullptr == m_v || m_v_index >= m_v_capacity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned int face_capacity = edge_capacity;

  if (edge_capacity + face_capacity + m_p_index > m_p_capacity )
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON__UINT_PTR* a = nullptr;
  if (0 != edge_capacity || 0 != face_capacity)
  {
    if ( edge_capacity > 0xFFFFu)
      return ON_SUBD_RETURN_ERROR(nullptr);
    if ( face_capacity > 0xFFFFu)
      return ON_SUBD_RETURN_ERROR(nullptr);
    a = AllocatePtrArray(edge_capacity + face_capacity, true);
    if (nullptr == a)
      return ON_SUBD_RETURN_ERROR(nullptr);
  }

  ON_SubDVertex* v = m_v + m_v_index;
  memset(v, 0, sizeof(*v));
  if (m_v_index > 0)
  {
    // code in ON_SubDFaceNeighborhood.Subdivide() relies on
    // m_next_vertex being set this way.
    m_v[m_v_index - 1].m_next_vertex = v;
    v->m_prev_vertex = &m_v[m_v_index - 1];
  }
  v->m_id = ++m_v_index;

  if (nullptr != vertexP)
  {
    v->m_P[0] = vertexP[0];
    v->m_P[1] = vertexP[1];
    v->m_P[2] = vertexP[2];
  }

  if (edge_capacity > 0)
  {
    v->m_edge_capacity = (unsigned short)edge_capacity;
    v->m_edges = (ON_SubDEdgePtr*)a;
    a += edge_capacity;
  }
  if (face_capacity > 0)
  {
    v->m_face_capacity = (unsigned short)face_capacity;
    v->m_faces = (const ON_SubDFace**)a;
  }
  a = 0;

  return v;
}